

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_header_copy(fdb_kvs_handle *handle,filemgr *new_file,docio_handle *new_dhandle,
                        uint64_t *new_file_kv_info_offset,bool create_new)

{
  bool bVar1;
  uint64_t uVar2;
  avl_node *paVar3;
  uint64_t *in_RCX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  kvs_header *src_h;
  kvs_header *dst_h;
  fdb_kvs_handle new_handle;
  uint64_t new_kv_info_offset;
  kvs_header *kv_header;
  kvs_node *node_new;
  kvs_node *node_old;
  avl_node *aa;
  avl_node *a;
  kvs_header *in_stack_fffffffffffffd90;
  long lVar4;
  kvs_header *in_stack_fffffffffffffd98;
  avl_cmp_func *func;
  filemgr *in_stack_fffffffffffffda0;
  avl_tree *in_stack_fffffffffffffda8;
  kvs_ops_stat *in_stack_fffffffffffffdb8;
  kvs_ops_stat *in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffde7;
  uint64_t in_stack_fffffffffffffde8;
  uint64_t in_stack_fffffffffffffdf0;
  docio_handle *in_stack_fffffffffffffdf8;
  kvs_header *in_stack_fffffffffffffe00;
  fdb_kvs_handle *in_stack_fffffffffffffe40;
  avl_node *local_30;
  
  if ((in_R8B & 1) != 0) {
    _fdb_kvs_header_create((kvs_header **)in_stack_fffffffffffffd90);
    fdb_kvs_header_read(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        (bool)in_stack_fffffffffffffde7);
    _fdb_kvs_handle::_fdb_kvs_handle((_fdb_kvs_handle *)0x15ef26);
    uVar2 = fdb_kvs_header_append(in_stack_fffffffffffffe40);
    if (in_RCX != (uint64_t *)0x0) {
      *in_RCX = uVar2;
    }
    bVar1 = filemgr_set_kv_header
                      (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (_func_void_filemgr_ptr *)in_stack_fffffffffffffd90);
    if (!bVar1) {
      _fdb_kvs_header_free(in_stack_fffffffffffffd90);
    }
    fdb_kvs_header_reset_all_stats(in_stack_fffffffffffffda0);
  }
  func = *(avl_cmp_func **)(in_RSI + 0x170);
  lVar4 = *(long *)(*(long *)(in_RDI + 0x48) + 0x170);
  pthread_spin_lock((pthread_spinlock_t *)(lVar4 + 0x38));
  pthread_spin_lock((pthread_spinlock_t *)(func + 0x38));
  *(undefined8 *)(func + 8) = *(undefined8 *)(lVar4 + 8);
  *(undefined8 *)(func + 0x10) = *(undefined8 *)(lVar4 + 0x10);
  func[0x28] = *(code *)(lVar4 + 0x28);
  local_30 = avl_first(*(avl_tree **)(lVar4 + 0x20));
  while( true ) {
    if (local_30 == (avl_node *)0x0) {
      pthread_spin_unlock((pthread_spinlock_t *)(func + 0x38));
      pthread_spin_unlock((pthread_spinlock_t *)(lVar4 + 0x38));
      return;
    }
    paVar3 = avl_search(in_stack_fffffffffffffda8,(avl_node *)in_stack_fffffffffffffda0,func);
    if (paVar3 == (avl_node *)0x0) break;
    paVar3[-7].right = local_30[-7].right;
    paVar3[-6].parent = local_30[-6].parent;
    paVar3[-7].parent = local_30[-7].parent;
    kvs_ops_stat::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_30 = avl_next(local_30);
  }
  __assert_fail("aa",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                ,0x2d5,
                "void fdb_kvs_header_copy(fdb_kvs_handle *, struct filemgr *, struct docio_handle *, uint64_t *, bool)"
               );
}

Assistant:

void fdb_kvs_header_copy(fdb_kvs_handle *handle,
                         struct filemgr *new_file,
                         struct docio_handle *new_dhandle,
                         uint64_t *new_file_kv_info_offset,
                         bool create_new)
{
    struct avl_node *a, *aa;
    struct kvs_node *node_old, *node_new;

    if (create_new) {
        struct kvs_header *kv_header;
        // copy KV header data in 'handle' to new file
        _fdb_kvs_header_create(&kv_header);
        // read from 'handle->dhandle', and import into 'new_file'
        fdb_kvs_header_read(kv_header, handle->dhandle,
                            handle->kv_info_offset, handle->file->version, false);

        // write KV header in 'new_file' using 'new_dhandle'
        uint64_t new_kv_info_offset;
        fdb_kvs_handle new_handle;
        new_handle.file = new_file;
        new_handle.dhandle = new_dhandle;
        new_handle.kv_info_offset = BLK_NOT_FOUND;
        new_kv_info_offset = fdb_kvs_header_append(&new_handle);
        if (new_file_kv_info_offset) {
            *new_file_kv_info_offset = new_kv_info_offset;
        }

        if (!filemgr_set_kv_header(new_file, kv_header, fdb_kvs_header_free)) {
            // LCOV_EXCL_START
            _fdb_kvs_header_free(kv_header);
        } // LCOV_EXCL_STOP
        fdb_kvs_header_reset_all_stats(new_file);
    }

    struct kvs_header* dst_h = new_file->kv_header;
    struct kvs_header* src_h = handle->file->kv_header;

    spin_lock(&src_h->lock);
    spin_lock(&dst_h->lock);
    // copy all in-memory custom cmp function pointers & seqnums
    dst_h->default_kvs_cmp = src_h->default_kvs_cmp;
    dst_h->default_kvs_cmp_param = src_h->default_kvs_cmp_param;
    dst_h->custom_cmp_enabled = src_h->custom_cmp_enabled;
    a = avl_first(src_h->idx_id);
    while (a) {
        node_old = _get_entry(a, struct kvs_node, avl_id);
        aa = avl_search(dst_h->idx_id,
                        &node_old->avl_id, _kvs_cmp_id);
        assert(aa); // MUST exist
        node_new = _get_entry(aa, struct kvs_node, avl_id);
        node_new->custom_cmp = node_old->custom_cmp;
        node_new->user_param = node_old->user_param;
        node_new->seqnum = node_old->seqnum;
        node_new->op_stat = node_old->op_stat;
        a = avl_next(a);
    }
    spin_unlock(&dst_h->lock);
    spin_unlock(&src_h->lock);
}